

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_tables.c
# Opt level: O2

int scanner_block_cmp_fn(ScannerBlock *a,ScannerBlock *b,hash_fns_t *fns)

{
  ScanState *pSVar1;
  ScanState *pSVar2;
  void *pvVar3;
  void *pvVar4;
  
  pvVar3 = fns->data[0];
  if ((long)fns->data[0] < 1) {
    pvVar3 = (void *)0x0;
  }
  pvVar4 = (void *)0x0;
  while( true ) {
    if (pvVar3 == pvVar4) {
      return 0;
    }
    pSVar1 = a->chars[(long)pvVar4];
    pSVar2 = b->chars[(long)pvVar4];
    if ((pSVar1 != pSVar2) &&
       (((pSVar1 == (ScanState *)0x0 || (pSVar2 == (ScanState *)0x0)) ||
        (pSVar1->index != pSVar2->index)))) break;
    pvVar4 = (void *)((long)pvVar4 + 1);
  }
  return 1;
}

Assistant:

static int scanner_block_cmp_fn(ScannerBlock *a, ScannerBlock *b, hash_fns_t *fns) {
  intptr_t i, block_size = (intptr_t)fns->data[0];
  ScanState **sa = a->chars;
  ScanState **sb = b->chars;

  for (i = 0; i < block_size; i++) {
    if (sa[i] == sb[i]) continue;
    if (!sa[i] || !sb[i]) return 1;
    if (sa[i]->index != sb[i]->index) return 1;
  }
  return 0;
}